

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest12::testAtomicDraw
          (FunctionalTest12 *this,GLuint subroutine_index,GLuint *expected_results)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  MessageBuilder local_1b8;
  byte local_31;
  uint *puStack_30;
  bool result;
  GLuint *atomic_results;
  Functions *gl;
  GLuint *expected_results_local;
  FunctionalTest12 *pFStack_10;
  GLuint subroutine_index_local;
  FunctionalTest12 *this_local;
  
  gl = (Functions *)expected_results;
  expected_results_local._4_4_ = subroutine_index;
  pFStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  atomic_results = (GLuint *)CONCAT44(extraout_var,iVar1);
  (**(code **)(atomic_results + 0x59a))(0x8b30,1,(long)&expected_results_local + 4);
  dVar2 = (**(code **)(atomic_results + 0x200))();
  glu::checkError(dVar2,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17dc);
  (**(code **)(atomic_results + 0x14e))(0,0,1);
  dVar2 = (**(code **)(atomic_results + 0x200))();
  glu::checkError(dVar2,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17e0);
  puStack_30 = (uint *)(**(code **)(atomic_results + 0x33e))(0x92c0,35000);
  dVar2 = (**(code **)(atomic_results + 0x200))();
  glu::checkError(dVar2,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17e4);
  iVar1 = memcmp(gl,puStack_30,0xc);
  local_31 = iVar1 == 0;
  if (!(bool)local_31) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [24])"Error. Invalid result. ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])"Result: [ ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,puStack_30);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,puStack_30 + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,puStack_30 + 2);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [4])" ] ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [13])"Expected: [ ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)gl);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl->activeShaderProgram + 4));
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)&gl->activeTexture);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x29ea7cd);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  (**(code **)(atomic_results + 0x59c))(0x92c0);
  dVar2 = (**(code **)(atomic_results + 0x200))();
  glu::checkError(dVar2,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17f4);
  return (bool)(local_31 & 1);
}

Assistant:

bool FunctionalTest12::testAtomicDraw(GLuint subroutine_index, const GLuint expected_results[3]) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &subroutine_index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Draw */
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Capture results */
	GLuint* atomic_results = (GLuint*)gl.mapBuffer(GL_ATOMIC_COUNTER_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	/* Verify */
	bool result = (0 == memcmp(expected_results, atomic_results, 3 * sizeof(GLuint)));

	if (false == result)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Error. Invalid result. "
			<< "Result: [ " << atomic_results[0] << ", " << atomic_results[1] << ", " << atomic_results[2] << " ] "
			<< "Expected: [ " << expected_results[0] << ", " << expected_results[1] << ", " << expected_results[2]
			<< " ]" << tcu::TestLog::EndMessage;
	}

	/* Unmap buffer */
	gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Done */
	return result;
}